

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  __int_type _Var2;
  Arena *in_RDI;
  int i;
  void **elements;
  int n;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  
  if (((in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i != 0) &&
     ((in_RDI->impl_).threads_._M_b._M_p == (__pointer_type)0x0)) {
    iVar1 = *(int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
    _Var2 = (in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      cast<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                (*(void **)(_Var2 + 8 + (long)iVar3 * 8));
      GenericTypeHandler<google::protobuf::EnumDescriptorProto>::Delete
                ((EnumDescriptorProto *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),in_RDI);
    }
    operator_delete((void *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i
                   );
  }
  (in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  if (rep_ != NULL && arena_ == NULL) {
    int n = rep_->allocated_size;
    void* const* elements = rep_->elements;
    for (int i = 0; i < n; i++) {
      TypeHandler::Delete(cast<TypeHandler>(elements[i]), NULL);
    }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(rep_), size);
#else
    ::operator delete(static_cast<void*>(rep_));
#endif
  }
  rep_ = NULL;
}